

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O3

int __thiscall chrono::ChLinkMask::RestoreRedundant(ChLinkMask *this)

{
  int iVar1;
  pointer ppCVar2;
  ChConstraintTwoBodies *pCVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  
  iVar1 = this->nconstr;
  if (0 < (long)iVar1) {
    ppCVar2 = (this->constraints).
              super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    iVar4 = 0;
    do {
      pCVar3 = ppCVar2[lVar5];
      if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.redundant == true) {
        (pCVar3->super_ChConstraintTwo).super_ChConstraint.redundant = false;
        bVar6 = false;
        if (((pCVar3->super_ChConstraintTwo).super_ChConstraint.valid == true) &&
           (bVar6 = false, ((pCVar3->super_ChConstraintTwo).super_ChConstraint.disabled & 1U) == 0))
        {
          if ((pCVar3->super_ChConstraintTwo).super_ChConstraint.broken == false) {
            bVar6 = (pCVar3->super_ChConstraintTwo).super_ChConstraint.mode != CONSTRAINT_FREE;
          }
          else {
            bVar6 = false;
          }
        }
        iVar4 = iVar4 + 1;
        (pCVar3->super_ChConstraintTwo).super_ChConstraint.active = bVar6;
      }
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    return iVar4;
  }
  return 0;
}

Assistant:

int ChLinkMask::RestoreRedundant() {
    int tot = 0;
    for (int j = 0; j < nconstr; j++) {
        if (Constr_N(j).IsRedundant()) {
            Constr_N(j).SetRedundant(false);
            tot++;
        }
    }
    return tot;
}